

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationValue.cpp
# Opt level: O2

string * __thiscall
Corrade::Utility::Implementation::IntegerConfigurationValue<unsigned_short>::toString_abi_cxx11_
          (string *__return_storage_ptr__,IntegerConfigurationValue<unsigned_short> *this,
          unsigned_short *value,ConfigurationValueFlags flags)

{
  uint *puVar1;
  uint uVar2;
  ostringstream stream;
  uint auStack_178 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
  if (((ulong)value & 2) == 0) {
    if (((ulong)value & 1) == 0) goto LAB_00149a98;
    uVar2 = 0x40;
  }
  else {
    uVar2 = 8;
  }
  *(uint *)((long)auStack_178 + *(long *)(_stream + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(_stream + -0x18)) & 0xffffffb5 | uVar2;
LAB_00149a98:
  if (((ulong)value & 8) != 0) {
    puVar1 = (uint *)((long)auStack_178 + *(long *)(_stream + -0x18));
    *puVar1 = *puVar1 | 0x4000;
  }
  std::ostream::operator<<(&stream,*(ushort *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

std::string IntegerConfigurationValue<T>::toString(const T& value, ConfigurationValueFlags flags) {
        std::ostringstream stream;

        /* Hexadecimal / octal values */
        if(flags & ConfigurationValueFlag::Hex)
            stream.setf(std::istringstream::hex, std::istringstream::basefield);
        else if(flags & ConfigurationValueFlag::Oct)
            stream.setf(std::istringstream::oct, std::istringstream::basefield);

        if(flags & ConfigurationValueFlag::Uppercase)
            stream.setf(std::istringstream::uppercase);

        stream << value;
        return stream.str();
    }